

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSA_SpikeEncodingSynapse.cpp
# Opt level: O3

void __thiscall BSA_SpikeEncodingSynapse::update(BSA_SpikeEncodingSynapse *this)

{
  _Map_pointer ppdVar1;
  BSA_SpikeEncodingSynapse_param *pBVar2;
  pointer pdVar3;
  _Elt_pointer pdVar4;
  Population *pPVar5;
  Event *pEVar6;
  Clock *pCVar7;
  double *pdVar8;
  long lVar9;
  pointer pdVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  double *pdVar15;
  long lVar16;
  difference_type __node_offset;
  double *pdVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  Clock::getCurrentTime(this->clock);
  resetOutput(this);
  iVar12 = this->inputSize;
  if (0 < iVar12) {
    uVar18 = 0;
    do {
      pEVar6 = (((this->super_Synapse).from_population)->output).
               super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar18];
      if (pEVar6->type == Value) {
        pdVar10 = (this->input).
                  super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pEVar6 = pEVar6 + 1;
        pdVar17 = pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (pdVar17 ==
            pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl.
            super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                    ((deque<double,std::allocator<double>> *)(pdVar10 + uVar18),(double *)pEVar6);
          pdVar10 = (this->input).
                    super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *pdVar17 = (double)pEVar6->_vptr_Event;
          *(double **)((deque<double,std::allocator<double>> *)(pdVar10 + uVar18) + 0x30) =
               pdVar17 + 1;
        }
        std::deque<double,_std::allocator<double>_>::pop_front(pdVar10 + uVar18);
        dVar19 = this->param->filter_length;
        dVar21 = 0.0;
        dVar20 = 0.0;
        if (0.0 < dVar19) {
          pdVar17 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar10 = (this->input).
                    super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar8 = pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur;
          ppdVar1 = pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_start._M_node;
          uVar11 = (long)pdVar8 -
                   (long)pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first >> 3;
          iVar12 = 1;
          do {
            uVar14 = (long)uVar11 >> 6;
            if ((long)uVar11 < 0) {
LAB_0011a388:
              dVar22 = ppdVar1[uVar14][uVar14 * -0x40 + uVar11] - *pdVar17;
              pdVar15 = (double *)
                        ((ulong)(((uint)uVar11 & 0x3f) << 3) + (long)ppdVar1[(long)uVar11 >> 6]);
            }
            else {
              if (0x3f < uVar11) {
                uVar14 = uVar11 >> 6;
                goto LAB_0011a388;
              }
              dVar22 = *pdVar8 - *pdVar17;
              pdVar15 = pdVar8;
            }
            dVar21 = dVar21 + ABS(dVar22);
            dVar20 = dVar20 + ABS(*pdVar15);
            dVar22 = (double)iVar12;
            pdVar17 = pdVar17 + 1;
            uVar11 = uVar11 + 1;
            pdVar8 = pdVar8 + 1;
            iVar12 = iVar12 + 1;
          } while (dVar22 < dVar19);
        }
        if (dVar21 <= dVar20 - this->param->threshold) {
          pEVar6 = (Event *)operator_new(0x28);
          pEVar6->_vptr_Event = (_func_int **)&PTR_setWeight_00129920;
          *(undefined4 *)&pEVar6[1]._vptr_Event = 1;
          *(undefined8 *)&pEVar6[1].type = 0x3ff0000000000000;
          pEVar6->type = Spike;
          pCVar7 = Clock::getInstance();
          dVar19 = Clock::getCurrentTime(pCVar7);
          pEVar6->eventTime = dVar19;
          (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] = pEVar6;
          (**(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar18]->_vptr_Event)(0x408c200000000000);
          Logging::logEvent(this->logger,(long)this,(int)uVar18,
                            (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar18]->type);
          pBVar2 = this->param;
          if (0.0 < pBVar2->filter_length) {
            pdVar3 = (this->filter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar10 = (this->input).
                      super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar4 = pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            lVar9 = (long)pdVar4 -
                    (long)pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl
                          .super__Deque_impl_data._M_start._M_first;
            ppdVar1 = pdVar10[uVar18].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_start._M_node;
            lVar13 = lVar9 >> 3;
            lVar16 = 0;
            do {
              uVar11 = lVar13 + lVar16;
              if ((long)uVar11 < 0) {
                uVar11 = (long)uVar11 >> 6;
LAB_0011a4f5:
                pdVar17 = (double *)((long)ppdVar1[uVar11] + lVar9 + uVar11 * -0x200);
              }
              else {
                if (0x3f < uVar11) {
                  uVar11 = uVar11 >> 6;
                  goto LAB_0011a4f5;
                }
                pdVar17 = pdVar4 + lVar16;
              }
              *pdVar17 = *pdVar17 - pdVar3[lVar16];
              lVar16 = lVar16 + 1;
              lVar9 = lVar9 + 8;
            } while ((double)(int)lVar16 < pBVar2->filter_length);
          }
        }
        else {
          pEVar6 = (Event *)operator_new(0x18);
          pEVar6->_vptr_Event = (_func_int **)&PTR_setWeight_00129970;
          pEVar6->type = No;
          pCVar7 = Clock::getInstance();
          dVar19 = Clock::getCurrentTime(pCVar7);
          pEVar6->eventTime = dVar19;
          (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] = pEVar6;
        }
        pPVar5 = (this->super_Synapse).to_population;
        (*pPVar5->_vptr_Population[5])
                  (pPVar5,uVar18 & 0xffffffff,
                   (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18]);
        iVar12 = this->inputSize;
      }
      uVar18 = uVar18 + 1;
    } while ((long)uVar18 < (long)iVar12);
  }
  return;
}

Assistant:

void BSA_SpikeEncodingSynapse::update() {
    double currentTime = clock->getCurrentTime();
    resetOutput();
    for(int i = 0; i < inputSize; i++) {
        if(from_population->output[i]->type == EventType::Value) {
            input[i].push_back(static_cast<ValueEvent*>(from_population->output[i])->value);
            input[i].pop_front();
            double error1 = 0;
            double error2 = 0;
            // Ben's Spiker Algorithm
            for(int j = 0; j < param->filter_length; j++) {
                error1 += abs(input[i][j] - filter[j]);
                error2 += abs(input[i][j]);
            }
            if(error1 <= (error2 - param->threshold)) {
                output[i] = new SpikeEvent();
                output[i]->setWeight(900.0);
                logger->logEvent((long)this, i, output[i]->type);
                for(int j = 0; j < param->filter_length; j++) {
                    input[i][j] -= filter[j];
                }
            }
            else {
                output[i] = new NoEvent();
            }
            to_population->setInput(i, output[i]);
        }
    }
}